

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,LinkedReadsDatastore *o)

{
  pointer in_RSI;
  WorkSpace *in_RDI;
  LinkedReadsMapper *unaff_retaddr;
  WorkSpace *_ws;
  
  _ws = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  LinkedReadsMapper::LinkedReadsMapper(unaff_retaddr,_ws,(LinkedReadsDatastore *)in_RSI);
  std::__cxx11::string::string((string *)&(in_RDI->sdg).oldnames_to_ids._M_h._M_rehash_policy);
  std::__cxx11::string::string((string *)&in_RDI->paired_reads_datastores);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c4928);
  (in_RDI->long_reads_datastores).
  super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->long_reads_datastores).
  super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RSI;
  std::vector<long,_std::allocator<long>_>::operator=
            ((vector<long,_std::allocator<long>_> *)this,(vector<long,_std::allocator<long>_> *)ws);
  std::
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ::operator=((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
               *)this,(vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                       *)ws);
  std::
  vector<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>,_std::allocator<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>_>_>
  ::operator=((vector<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>,_std::allocator<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>_>_>
               *)this,(vector<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>,_std::allocator<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>_>_>
                       *)ws);
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, const LinkedReadsDatastore &o) : ws(ws), mapper(ws, *this) {
    mapper.read_to_node = o.mapper.read_to_node;
    mapper.reads_in_node = o.mapper.reads_in_node;
    mapper.tag_neighbours = o.mapper.tag_neighbours;
}